

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O0

void __thiscall
Lib::
Map<const_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_*,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
::clear(Map<const_Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_*,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
        *this)

{
  Entry *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  if (in_RDI->_key !=
      (MaybeUninit<const_Kernel::Polynom<Kernel::NumTraits<IntegerConstantType>_>_*>)0x0) {
    array_delete<Lib::Map<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>const*,Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>,Lib::DerefPtrHash<Lib::StlHash>>::Entry>
              (in_RDI,in_stack_ffffffffffffffe8);
    Lib::free((void *)in_RDI->_key);
  }
  in_RDI->code = 0;
  *(undefined4 *)&in_RDI->field_0x4 = 0;
  in_RDI->_key = (MaybeUninit<const_Kernel::Polynom<Kernel::NumTraits<IntegerConstantType>_>_*>)0x0;
  (in_RDI->_value).__align = (anon_struct_8_0_00000001_for___align)0x0;
  *(undefined4 *)((long)&in_RDI->_value + 8) = 0;
  return;
}

Assistant:

void clear()
  {
    if (_entries) {
      array_delete(_entries, _capacity);
      DEALLOC_KNOWN(_entries,sizeof(Entry)*_capacity,"Map<>");
    }
    _capacity    = 0;
    _noOfEntries = 0;
    _entries     = nullptr;
    _afterLast   = nullptr;
    _maxEntries  = 0;
  }